

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

void silly_thing(char *word,obj *otmp)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  bVar1 = otmp->oclass;
  sVar2 = otmp->otyp;
  if (bVar1 == 3) {
    iVar4 = strcmp(word,"put on");
    if (iVar4 == 0) {
      pcVar7 = "ELAM EBOW";
      pcVar6 = "wear";
LAB_001aff08:
      pcVar7 = pcVar7 + 8;
      pcVar8 = "";
    }
    else {
      iVar4 = strcmp(word,"remove");
      if (iVar4 != 0) goto LAB_001afeb3;
      pcVar7 = "T";
      pcVar6 = "take";
      pcVar8 = " off";
    }
LAB_001aff0f:
    bVar3 = false;
  }
  else {
    if (((((bVar1 & 0xfe) == 4) || (sVar2 == 0xed)) || (sVar2 == 0x113)) ||
       (((int)sVar2 & 0xfffeU) == 0xee)) {
      iVar4 = strcmp(word,"wear");
      if (iVar4 == 0) {
        pcVar7 = "P";
        pcVar6 = "put";
        pcVar8 = " on";
        goto LAB_001aff0f;
      }
      iVar4 = strcmp(word,"take off");
      if (iVar4 == 0) {
        pcVar7 = "ZELGO MER";
        pcVar6 = "remove";
        goto LAB_001aff08;
      }
    }
LAB_001afeb3:
    bVar3 = true;
    pcVar8 = (char *)0x0;
    pcVar6 = (char *)0x0;
    pcVar7 = (char *)0x0;
  }
  if (bVar3) {
    pline("That is a silly thing to %s.",word,pcVar6);
    return;
  }
  if (((int)sVar2 == 0xed) ||
     ((pcVar5 = "that", bVar1 == 3 &&
      ((objects[sVar2].oc_subtyp == '\x03' || (objects[sVar2].oc_subtyp == '\x04')))))) {
    pcVar5 = "those";
  }
  pline("Use the \'%s\' command to %s %s%s.",pcVar7,pcVar6,pcVar5,pcVar8);
  return;
}

Assistant:

void silly_thing(const char *word, struct obj *otmp)
{
	const char *s1, *s2, *s3, *what;
	int ocls = otmp->oclass, otyp = otmp->otyp;

	s1 = s2 = s3 = 0;
	/* check for attempted use of accessory commands ('P','R') on armor
	   and for corresponding armor commands ('W','T') on accessories */
	if (ocls == ARMOR_CLASS) {
	    if (!strcmp(word, "put on"))
		s1 = "W", s2 = "wear", s3 = "";
	    else if (!strcmp(word, "remove"))
		s1 = "T", s2 = "take", s3 = " off";
	} else if ((ocls == RING_CLASS || otyp == MEAT_RING) ||
		ocls == AMULET_CLASS ||
		(otyp == BLINDFOLD || otyp == TOWEL || otyp == LENSES)) {
	    if (!strcmp(word, "wear"))
		s1 = "P", s2 = "put", s3 = " on";
	    else if (!strcmp(word, "take off"))
		s1 = "R", s2 = "remove", s3 = "";
	}
	if (s1) {
	    what = "that";
	    /* quantity for armor and accessory objects is always 1,
	       but some things should be referred to as plural */
	    if (otyp == LENSES || is_gloves(otmp) || is_boots(otmp))
		what = "those";
	    pline("Use the '%s' command to %s %s%s.", s1, s2, what, s3);
	} else {
	    pline("That is a silly thing to %s.", word);
	}
}